

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase
          (IncompleteCubeMissingLevelCase *this,TestContext *testCtx,RenderContext *renderCtx,
          char *name,char *description,IVec2 *size,int invalidLevelNdx,CubeFace invalidCubeFace)

{
  TexCubeCompletenessCase::TexCubeCompletenessCase
            (&this->super_TexCubeCompletenessCase,testCtx,renderCtx,name,description);
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0071a840;
  *(int *)&(this->super_TexCubeCompletenessCase).field_0x84 = invalidLevelNdx;
  this->m_invalidCubeFace = invalidCubeFace;
  tcu::Vector<int,_2>::Vector(&this->m_size,size);
  return;
}

Assistant:

IncompleteCubeMissingLevelCase::IncompleteCubeMissingLevelCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, int invalidLevelNdx, tcu::CubeFace invalidCubeFace)
	: TexCubeCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx				(invalidLevelNdx)
	, m_invalidCubeFace				(invalidCubeFace)
	, m_size						(size)
{
}